

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdump.cpp
# Opt level: O2

void mmdump(int f,uint64_t offset,uint64_t length,uint64_t step,uint64_t width,int access,
           int mmapmode)

{
  uint8_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint8_t *puVar5;
  uint8_t *src;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  mappedmem m;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_98;
  uint64_t local_80;
  uint64_t local_78;
  ulong local_70;
  allocator_type local_68 [24];
  mappedmem local_50;
  
  local_78 = step;
  mappedmem::mappedmem(&local_50,f,offset,length + offset,mmapmode);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,width,local_68);
  src = local_50.pmem + local_50.dataofs;
  lVar6 = length - (long)src;
  local_80 = length;
  local_70 = (ulong)(uint)access;
  while( true ) {
    uVar2 = local_50.dataofs;
    puVar1 = local_50.pmem;
    if (local_50.pmem + local_80 + local_50.dataofs <= src) {
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_98);
      mappedmem::~mappedmem(&local_50);
      return;
    }
    uVar4 = (long)(local_50.pmem + local_80 + local_50.dataofs) - (long)src;
    uVar3 = width;
    if (uVar4 < width) {
      uVar3 = uVar4;
    }
    copydata(local_98._M_impl.super__Vector_impl_data._M_start,src,(int)uVar3,(int)local_70);
    if (uVar4 < width) {
      puVar5 = puVar1 + lVar6 + uVar2;
      if (width < puVar1 + lVar6 + uVar2) {
        puVar5 = (uint8_t *)width;
      }
      for (; (uint8_t *)width != puVar5; puVar5 = puVar5 + 1) {
        local_98._M_impl.super__Vector_impl_data._M_start[(long)puVar5] = '\0';
      }
    }
    if (access - 1U < 8) break;
    src = src + local_78;
    lVar6 = lVar6 - local_78;
  }
  (*(code *)(&DAT_0010b024 + *(int *)(&DAT_0010b024 + (ulong)(access - 1U) * 4)))();
  return;
}

Assistant:

void mmdump(int f, uint64_t offset, uint64_t length, uint64_t step, uint64_t width, int access, int mmapmode)
{
    mappedmem m(f, offset, offset+length, mmapmode);

    std::vector<uint8_t> data(width);
    for (uint8_t *p= m.data() ; p<m.data()+length ; p+=step)
    {
        uint64_t want= std::min((uint64_t)(m.data()+length-p), width);
        copydata(&data[0], p, want, access);
        if (want<width)
            std::fill(&data[want], &data[width], 0);
        switch(access)
        {
        case 1: print("%08llx: %b", offset, std::vector<uint8_t>(&data[0], &data[0]+width/access));
        case 2: print("%08llx: %b", offset, std::vector<uint16_t>(&data[0], &data[0]+width/access));
        case 4: print("%08llx: %b", offset, std::vector<uint32_t>(&data[0], &data[0]+width/access));
        case 8: print("%08llx: %b", offset, std::vector<uint64_t>(&data[0], &data[0]+width/access));
        }

        offset += step;
    }
}